

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIoa.c
# Opt level: O1

Aig_Man_t * Saig_ManReadBlif(char *pFileName)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Aig_Man_t *pAVar5;
  Aig_Man_t *p;
  size_t sVar6;
  char *pcVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  long lVar10;
  void *pvVar11;
  Aig_Man_t *p_00;
  Vec_Ptr_t *p_01;
  Aig_Obj_t *p0;
  char *pToken;
  bool bVar12;
  double dVar13;
  undefined1 auVar14 [16];
  int local_4c;
  int *local_48;
  int local_3c;
  
  pAVar5 = (Aig_Man_t *)fopen(pFileName,"r");
  if (pAVar5 == (Aig_Man_t *)0x0) {
    pcVar7 = "Saig_ManReadBlif(): Cannot open file for reading.";
  }
  else {
    do {
      iVar2 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
      if (iVar2 != 1) {
        pcVar7 = "Saig_ManReadBlif(): Error 1.";
        goto LAB_00624aa0;
      }
    } while (Saig_ManReadToken::Buffer[0] != '.');
    iVar2 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
    if (iVar2 == 1) {
      p = Aig_ManStart(10000);
      sVar6 = strlen(Saig_ManReadToken::Buffer);
      pcVar7 = (char *)malloc(sVar6 + 1);
      strcpy(pcVar7,Saig_ManReadToken::Buffer);
      p->pName = pcVar7;
      if (pFileName == (char *)0x0) {
        pcVar7 = (char *)0x0;
      }
      else {
        sVar6 = strlen(pFileName);
        pcVar7 = (char *)malloc(sVar6 + 1);
        strcpy(pcVar7,pFileName);
      }
      p->pSpec = pcVar7;
      iVar2 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
      if ((iVar2 == 1) &&
         (CONCAT17(Saig_ManReadToken::Buffer[7],
                   CONCAT43(Saig_ManReadToken::Buffer._3_4_,
                            CONCAT12(Saig_ManReadToken::Buffer[2],
                                     CONCAT11(Saig_ManReadToken::Buffer[1],
                                              Saig_ManReadToken::Buffer[0])))) == 0x737475706e692e))
      {
        iVar2 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
        if (iVar2 == 1) {
          iVar2 = 0;
          do {
            if (Saig_ManReadToken::Buffer[0] == '.') {
              iVar3 = strcmp(Saig_ManReadToken::Buffer,".outputs");
              if (iVar3 == 0) {
                iVar3 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
                if (iVar3 != 1) goto LAB_00624bc5;
                iVar3 = 0;
                goto LAB_00624ba5;
              }
              break;
            }
            iVar2 = iVar2 + 1;
            iVar3 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
          } while (iVar3 == 1);
        }
        pcVar7 = "Saig_ManReadBlif(): Error 4.";
      }
      else {
        pcVar7 = "Saig_ManReadBlif(): Error 3.";
      }
      goto LAB_00624b66;
    }
    pcVar7 = "Saig_ManReadBlif(): Error 2.";
  }
LAB_00624aa0:
  puts(pcVar7);
  return (Aig_Man_t *)0x0;
  while( true ) {
    iVar4 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
    iVar3 = iVar3 + -1;
    if (iVar4 != 1) break;
LAB_00624ba5:
    if (Saig_ManReadToken::Buffer[0] == '.') {
      local_4c = 0;
      if (Saig_ManReadToken::Buffer._3_4_ != 0x686374 ||
          CONCAT13(Saig_ManReadToken::Buffer[3],
                   CONCAT12(Saig_ManReadToken::Buffer[2],CONCAT11(Saig_ManReadToken::Buffer[1],0x2e)
                           )) != 0x74616c2e) goto LAB_00624bf4;
      local_4c = 0;
      goto LAB_00624c75;
    }
  }
LAB_00624bc5:
  pcVar7 = "Saig_ManReadBlif(): Error 5.";
  goto LAB_00624b66;
  while( true ) {
    iVar4 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
    if (iVar4 != 1) {
      pcVar7 = "Saig_ManReadBlif(): Error 8.";
      goto LAB_00624b66;
    }
    iVar4 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
    if (iVar4 != 1) {
      pcVar7 = "Saig_ManReadBlif(): Error 9.";
      goto LAB_00624b66;
    }
    local_4c = local_4c + 1;
    if (Saig_ManReadToken::Buffer._3_4_ != 0x686374 ||
        CONCAT13(Saig_ManReadToken::Buffer[3],
                 CONCAT12(Saig_ManReadToken::Buffer[2],
                          CONCAT11(Saig_ManReadToken::Buffer[1],Saig_ManReadToken::Buffer[0]))) !=
        0x74616c2e) break;
LAB_00624c75:
    iVar4 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
    if (iVar4 != 1) {
      pcVar7 = "Saig_ManReadBlif(): Error 6.";
      goto LAB_00624b66;
    }
    iVar4 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
    if (iVar4 != 1) {
      pcVar7 = "Saig_ManReadBlif(): Error 7.";
      goto LAB_00624b66;
    }
  }
LAB_00624bf4:
  if (local_4c != 0 || iVar2 != 0) {
    iVar2 = iVar2 + local_4c;
    do {
      Aig_ObjCreateCi(p);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  Aig_ManSetRegNum(p,local_4c);
  if (Saig_ManReadToken::Buffer._3_4_ == 0x73656d &&
      CONCAT13(Saig_ManReadToken::Buffer[3],
               CONCAT12(Saig_ManReadToken::Buffer[2],
                        CONCAT11(Saig_ManReadToken::Buffer[1],Saig_ManReadToken::Buffer[0]))) ==
      0x6d616e2e) {
    local_3c = 0;
    local_48 = (int *)0x0;
    do {
      pToken = Saig_ManReadToken::Buffer;
      iVar2 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
      pcVar7 = Saig_ManReadToken::Buffer;
      if (iVar2 != 1) {
        pcVar7 = (char *)0x0;
      }
      bVar12 = local_3c == 0;
      local_3c = local_3c + -1;
      if ((bVar12) && (*pcVar7 == 'n')) {
        iVar2 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
        if ((iVar2 != 1) ||
           (CONCAT11(Saig_ManReadToken::Buffer[1],Saig_ManReadToken::Buffer[0]) != 0x31)) {
          pcVar7 = "Saig_ManReadBlif(): Error 10.";
          goto LAB_00624b66;
        }
        iVar2 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
        if (iVar2 != 1) {
          pcVar7 = "Saig_ManReadBlif(): Error 11.";
          goto LAB_00624b66;
        }
      }
      else {
        pAVar8 = Saig_ManReadNode(p,local_48,pcVar7);
        iVar2 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
        if (iVar2 != 1) {
          pToken = (char *)0x0;
        }
        if (*pToken == 'l') {
          pcVar7 = Saig_ManReadToken::Buffer;
          if (iVar2 != 1) {
            pcVar7 = (char *)0x0;
          }
          if (pcVar7[1] == 'i') {
LAB_00624e0f:
            iVar2 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
            cVar1 = Saig_ManReadToken::Buffer[0];
            if (iVar2 == 1) {
              iVar2 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
              if ((iVar2 == 1) &&
                 (CONCAT11(Saig_ManReadToken::Buffer[1],Saig_ManReadToken::Buffer[0]) == 0x31)) {
                pAVar9 = (Aig_Obj_t *)((ulong)pAVar8 ^ 1);
                if (cVar1 != '0') {
                  pAVar9 = pAVar8;
                }
                Aig_ObjCreateCo(p,pAVar9);
                iVar2 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
                if (iVar2 == 1) goto LAB_00625018;
                pcVar7 = "Saig_ManReadBlif(): Error 14.";
              }
              else {
                pcVar7 = "Saig_ManReadBlif(): Error 13.";
              }
            }
            else {
              pcVar7 = "Saig_ManReadBlif(): Error 12.";
            }
            goto LAB_00624b66;
          }
        }
        else if (*pToken == 'p') {
          pcVar7 = Saig_ManReadToken::Buffer;
          if (iVar2 != 1) {
            pcVar7 = (char *)0x0;
          }
          if (pcVar7[1] == 'o') goto LAB_00624e0f;
        }
        pAVar9 = Saig_ManReadNode(p,local_48,pToken);
        pcVar7 = Saig_ManReadToken::Buffer;
        p_00 = pAVar5;
        iVar2 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
        if (iVar2 != 1) {
          pcVar7 = (char *)0x0;
        }
        iVar2 = Saig_ManReadNumber(p_00,pcVar7);
        if (local_48 == (int *)0x0) {
          sVar6 = strlen(pcVar7);
          lVar10 = sVar6 - 1;
          auVar14._8_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar14._0_8_ = lVar10;
          auVar14._12_4_ = 0x45300000;
          dVar13 = pow(10.0,(auVar14._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
          local_48 = (int *)calloc((long)(int)dVar13,4);
        }
        iVar4 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
        if (iVar4 != 1) {
          pcVar7 = "Saig_ManReadBlif(): Error 15.";
          goto LAB_00624b66;
        }
        p0 = (Aig_Obj_t *)((ulong)pAVar8 ^ 1);
        if (Saig_ManReadToken::Buffer[0] != '0') {
          p0 = pAVar8;
        }
        pAVar8 = (Aig_Obj_t *)((ulong)pAVar9 ^ 1);
        if (Saig_ManReadToken::Buffer[1] != '0') {
          pAVar8 = pAVar9;
        }
        iVar4 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
        if ((iVar4 != 1) ||
           (CONCAT11(Saig_ManReadToken::Buffer[1],Saig_ManReadToken::Buffer[0]) != 0x31)) {
          pcVar7 = "Saig_ManReadBlif(): Error 16.";
          goto LAB_00624b66;
        }
        iVar4 = __isoc99_fscanf(pAVar5,"%s",Saig_ManReadToken::Buffer);
        if (iVar4 != 1) {
          pcVar7 = "Saig_ManReadBlif(): Error 17.";
          goto LAB_00624b66;
        }
        pAVar8 = Aig_And(p,p0,pAVar8);
        if (((ulong)pAVar8 & 1) != 0) {
          pcVar7 = "Saig_ManReadBlif(): Error 18.";
          goto LAB_00624b66;
        }
        local_48[iVar2] = pAVar8->Id;
      }
LAB_00625018:
      iVar2 = strcmp(Saig_ManReadToken::Buffer,".names");
    } while (iVar2 == 0);
  }
  else {
    local_48 = (int *)0x0;
  }
  iVar2 = strcmp(Saig_ManReadToken::Buffer,".end");
  if (iVar2 == 0) {
    if (local_4c - p->nObjs[3] == iVar3) {
      p_01 = p->vCis;
      if (0 < p_01->nSize) {
        iVar2 = 0;
        do {
          pvVar11 = Vec_PtrEntry(p_01,iVar2);
          local_48[*(int *)((long)pvVar11 + 0x24)] = *(int *)((long)pvVar11 + 0x24);
          iVar2 = iVar2 + 1;
          p_01 = p->vCis;
        } while (iVar2 < p_01->nSize);
      }
      p->pData = local_48;
      Aig_ManSetRegNum(p,local_4c);
      iVar2 = Aig_ManCheck(p);
      if (iVar2 == 0) {
        puts("Saig_ManReadBlif(): Check has failed.");
        return p;
      }
      return p;
    }
    pcVar7 = "Saig_ManReadBlif(): Error 20.";
  }
  else {
    pcVar7 = "Saig_ManReadBlif(): Error 19.";
  }
LAB_00624b66:
  puts(pcVar7);
  Aig_ManStop(p);
  return (Aig_Man_t *)0x0;
}

Assistant:

Aig_Man_t * Saig_ManReadBlif( char * pFileName )
{
    FILE * pFile;
    Aig_Man_t * p;
    Aig_Obj_t * pFanin0, * pFanin1, * pNode;
    char * pToken;
    int i, nPis, nPos, nRegs, Number;
    int * pNum2Id = NULL;  // mapping of node numbers in the file into AIG node IDs
    // open the file
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Saig_ManReadBlif(): Cannot open file for reading.\n" );
        return NULL;
    }
    // skip through the comments
    for ( i = 0; (pToken = Saig_ManReadToken( pFile )) && pToken[0] != '.'; i++ );
    if ( pToken == NULL ) 
        { printf( "Saig_ManReadBlif(): Error 1.\n" ); return NULL; }
    // get he model
    pToken = Saig_ManReadToken( pFile );
    if ( pToken == NULL ) 
        { printf( "Saig_ManReadBlif(): Error 2.\n" ); return NULL; }
    // start the package
    p = Aig_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( pToken );
    p->pSpec = Abc_UtilStrsav( pFileName );
    // count PIs
    pToken = Saig_ManReadToken( pFile );
    if ( pToken == NULL || strcmp( pToken, ".inputs" ) ) 
        { printf( "Saig_ManReadBlif(): Error 3.\n" ); Aig_ManStop(p); return NULL; }
    for ( nPis = 0; (pToken = Saig_ManReadToken( pFile )) && pToken[0] != '.'; nPis++ );
    // count POs
    if ( pToken == NULL || strcmp( pToken, ".outputs" ) ) 
        { printf( "Saig_ManReadBlif(): Error 4.\n" ); Aig_ManStop(p); return NULL; }
    for ( nPos = 0; (pToken = Saig_ManReadToken( pFile )) && pToken[0] != '.'; nPos++ );
    // count latches
    if ( pToken == NULL ) 
        { printf( "Saig_ManReadBlif(): Error 5.\n" ); Aig_ManStop(p); return NULL; }
    for ( nRegs = 0; strcmp( pToken, ".latch" ) == 0; nRegs++ )
    {
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 6.\n" ); Aig_ManStop(p); return NULL; }
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 7.\n" ); Aig_ManStop(p); return NULL; }
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 8.\n" ); Aig_ManStop(p); return NULL; }
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 9.\n" ); Aig_ManStop(p); return NULL; }
    }
    // create PIs and LOs
    for ( i = 0; i < nPis + nRegs; i++ )
        Aig_ObjCreateCi( p );
    Aig_ManSetRegNum( p, nRegs );
    // create nodes
    for ( i = 0; strcmp( pToken, ".names" ) == 0; i++ )
    {
        // first token
        pToken = Saig_ManReadToken( pFile );
        if ( i == 0 && pToken[0] == 'n' )
        { // constant node
            // read 1
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL || strcmp( pToken, "1" ) ) 
                { printf( "Saig_ManReadBlif(): Error 10.\n" ); Aig_ManStop(p); return NULL; }
            // read next
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL ) 
                { printf( "Saig_ManReadBlif(): Error 11.\n" ); Aig_ManStop(p); return NULL; }
            continue;
        }
        pFanin0 = Saig_ManReadNode( p, pNum2Id, pToken );

        // second token
        pToken = Saig_ManReadToken( pFile );
        if ( (pToken[0] == 'p' && pToken[1] == 'o') || (pToken[0] == 'l' && pToken[1] == 'i') )
        { // buffer
            // read complemented attribute
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL ) 
                { printf( "Saig_ManReadBlif(): Error 12.\n" ); Aig_ManStop(p); return NULL; }
            if ( pToken[0] == '0' )
                pFanin0 = Aig_Not(pFanin0);
            // read 1
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL || strcmp( pToken, "1" ) ) 
                { printf( "Saig_ManReadBlif(): Error 13.\n" ); Aig_ManStop(p); return NULL; }
            Aig_ObjCreateCo( p, pFanin0 );
            // read next
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL ) 
                { printf( "Saig_ManReadBlif(): Error 14.\n" ); Aig_ManStop(p); return NULL; }
            continue;
        }

        // third token
        // regular node
        pFanin1 = Saig_ManReadNode( p, pNum2Id, pToken );
        pToken = Saig_ManReadToken( pFile );
        Number = Saig_ManReadNumber( p, pToken );
        // allocate mapping
        if ( pNum2Id == NULL )
        {
//            extern double pow( double x, double y );
            int Size = (int)pow(10.0, (double)(strlen(pToken) - 1));
            pNum2Id = ABC_CALLOC( int, Size );
        }

        // other tokens
        // get the complemented attributes
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 15.\n" ); Aig_ManStop(p); return NULL; }
        if ( pToken[0] == '0' )
            pFanin0 = Aig_Not(pFanin0);
        if ( pToken[1] == '0' )
            pFanin1 = Aig_Not(pFanin1);
        // read 1
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL || strcmp( pToken, "1" ) ) 
            { printf( "Saig_ManReadBlif(): Error 16.\n" ); Aig_ManStop(p); return NULL; }
        // read next
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 17.\n" ); Aig_ManStop(p); return NULL; }

        // create new node
        pNode = Aig_And( p, pFanin0, pFanin1 );
        if ( Aig_IsComplement(pNode) )
            { printf( "Saig_ManReadBlif(): Error 18.\n" ); Aig_ManStop(p); return NULL; }
        // set mapping
        pNum2Id[ Number ] = pNode->Id;
    }
    if ( pToken == NULL || strcmp( pToken, ".end" ) ) 
        { printf( "Saig_ManReadBlif(): Error 19.\n" ); Aig_ManStop(p); return NULL; }
    if ( nPos + nRegs != Aig_ManCoNum(p) ) 
        { printf( "Saig_ManReadBlif(): Error 20.\n" ); Aig_ManStop(p); return NULL; }
    // add non-node objects to the mapping
    Aig_ManForEachCi( p, pNode, i )
        pNum2Id[pNode->Id] = pNode->Id;
//    ABC_FREE( pNum2Id );
    p->pData = pNum2Id;
    // check the new manager
    Aig_ManSetRegNum( p, nRegs );
    if ( !Aig_ManCheck(p) )
        printf( "Saig_ManReadBlif(): Check has failed.\n" );
    return p;
}